

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzarc3d.h
# Opt level: O1

void __thiscall
pzgeom::TPZArc3D::GradX<Fad<double>>
          (TPZArc3D *this,TPZFMatrix<double> *coord,TPZVec<Fad<double>_> *par,
          TPZFMatrix<Fad<double>_> *gradx)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  double dVar4;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_> *pFVar8;
  Fad<double> *pFVar9;
  Fad<double> *pFVar10;
  void *pvVar11;
  double *pdVar12;
  double *pdVar13;
  ulong uVar14;
  int i;
  long lVar15;
  long lVar16;
  double dVar17;
  double dVar18;
  value_type vVar19;
  Fad<double> scale;
  Fad<double> Vtnorm;
  TPZManVector<Fad<double>,_10> OUTv;
  TPZManVector<Fad<double>,_10> Vpb;
  TPZManVector<Fad<double>,_10> Vpa;
  TPZManVector<Fad<double>,_10> Vpc;
  TPZManVector<Fad<double>,_10> middle;
  TPZManVector<Fad<double>,_10> Vt;
  undefined1 local_990 [16];
  double *local_980;
  double local_978;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_970;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_> local_960;
  Fad<double> *local_950;
  Fad<double> *local_948;
  undefined1 local_940 [24];
  double *pdStack_928;
  Fad<double> *local_918;
  FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>_>
  local_910;
  undefined1 local_8f8 [16];
  double *local_8e8;
  double dStack_8e0;
  undefined1 local_8d8 [32];
  Fad<double> *local_8b8;
  Fad<double> *local_8b0;
  undefined1 local_8a8 [16];
  Fad<double> **local_898;
  Fad<double> *local_890;
  double dStack_888;
  FadExpr<FadFuncSqrt<Fad<double>_>_> *local_880;
  undefined1 local_878 [8];
  TPZManVector<Fad<double>,_10> local_870;
  TPZManVector<Fad<double>,_10> local_710;
  TPZManVector<Fad<double>,_10> local_5b0;
  TPZManVector<Fad<double>,_10> local_450;
  TPZManVector<Fad<double>,_10> local_2f0;
  TPZManVector<Fad<double>,_10> local_190;
  
  local_5b0.super_TPZVec<Fad<double>_>._vptr_TPZVec = (_func_int **)0x0;
  local_5b0.super_TPZVec<Fad<double>_>.fStore._0_4_ = 0;
  local_5b0.super_TPZVec<Fad<double>_>.fNElements = 0;
  local_5b0.super_TPZVec<Fad<double>_>.fNAlloc = 0;
  TPZManVector<Fad<double>,_10>::TPZManVector(&local_450,3,(Fad<double> *)&local_5b0);
  Fad<double>::~Fad((Fad<double> *)&local_5b0);
  local_710.super_TPZVec<Fad<double>_>._vptr_TPZVec = (_func_int **)0x0;
  local_710.super_TPZVec<Fad<double>_>.fStore._0_4_ = 0;
  local_710.super_TPZVec<Fad<double>_>.fNElements = 0;
  local_710.super_TPZVec<Fad<double>_>.fNAlloc = 0;
  TPZManVector<Fad<double>,_10>::TPZManVector(&local_5b0,3,(Fad<double> *)&local_710);
  Fad<double>::~Fad((Fad<double> *)&local_710);
  local_190.super_TPZVec<Fad<double>_>._vptr_TPZVec = (_func_int **)0x0;
  local_190.super_TPZVec<Fad<double>_>.fStore._0_4_ = 0;
  local_190.super_TPZVec<Fad<double>_>.fNElements = 0;
  local_190.super_TPZVec<Fad<double>_>.fNAlloc = 0;
  TPZManVector<Fad<double>,_10>::TPZManVector(&local_710,3,(Fad<double> *)&local_190);
  Fad<double>::~Fad((Fad<double> *)&local_190);
  local_870.super_TPZVec<Fad<double>_>._vptr_TPZVec = (_func_int **)0x0;
  local_870.super_TPZVec<Fad<double>_>.fStore._0_4_ = 0;
  local_870.super_TPZVec<Fad<double>_>.fNElements = 0;
  local_870.super_TPZVec<Fad<double>_>.fNAlloc = 0;
  TPZManVector<Fad<double>,_10>::TPZManVector(&local_190,3,(Fad<double> *)&local_870);
  Fad<double>::~Fad((Fad<double> *)&local_870);
  local_2f0.super_TPZVec<Fad<double>_>._vptr_TPZVec = (_func_int **)0x0;
  local_2f0.super_TPZVec<Fad<double>_>.fStore._0_4_ = 0;
  local_2f0.super_TPZVec<Fad<double>_>.fNElements = 0;
  local_2f0.super_TPZVec<Fad<double>_>.fNAlloc = 0;
  TPZManVector<Fad<double>,_10>::TPZManVector(&local_870,3,(Fad<double> *)&local_2f0);
  Fad<double>::~Fad((Fad<double> *)&local_2f0);
  local_940._0_8_ = (Fad<double> *)0x0;
  local_940._8_8_ = (ulong)(uint)local_940._12_4_ << 0x20;
  local_940._16_8_ = (double *)0x0;
  pdStack_928 = (double *)0x0;
  TPZManVector<Fad<double>,_10>::TPZManVector(&local_2f0,1,(Fad<double> *)local_940);
  Fad<double>::~Fad((Fad<double> *)local_940);
  X<Fad<double>>(this,coord,&local_2f0.super_TPZVec<Fad<double>_>,
                 &local_870.super_TPZVec<Fad<double>_>);
  if (((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  dVar17 = *coord->fElem;
  pdVar13 = (double *)
            CONCAT44(local_870.super_TPZVec<Fad<double>_>.fStore._4_4_,
                     local_870.super_TPZVec<Fad<double>_>.fStore._0_4_);
  pdVar12 = (double *)
            CONCAT44(local_5b0.super_TPZVec<Fad<double>_>.fStore._4_4_,
                     local_5b0.super_TPZVec<Fad<double>_>.fStore._0_4_);
  uVar1 = *(uint *)(pdVar13 + 1);
  uVar2 = *(uint *)(pdVar12 + 1);
  if (uVar1 != uVar2) {
    if (uVar1 == 0) {
      if (uVar2 != 0) {
        if ((void *)pdVar12[2] != (void *)0x0) {
          operator_delete__((void *)pdVar12[2]);
        }
        *(undefined4 *)(pdVar12 + 1) = 0;
        pdVar12[2] = 0.0;
      }
    }
    else {
      if (uVar2 != 0) {
        if ((void *)pdVar12[2] != (void *)0x0) {
          operator_delete__((void *)pdVar12[2]);
        }
        *(undefined4 *)(pdVar12 + 1) = 0;
        pdVar12[2] = 0.0;
      }
      *(uint *)(pdVar12 + 1) = uVar1;
      uVar14 = 0xffffffffffffffff;
      if (-1 < (int)uVar1) {
        uVar14 = (long)(int)uVar1 << 3;
      }
      pvVar11 = operator_new__(uVar14);
      pdVar12[2] = (double)pvVar11;
    }
  }
  if (uVar1 != 0) {
    dVar18 = pdVar12[2];
    if (*(int *)(pdVar13 + 1) == 0) {
      if (0 < (int)uVar1) {
        uVar14 = 0;
        do {
          *(double *)((long)dVar18 + uVar14 * 8) = -pdVar13[3];
          uVar14 = uVar14 + 1;
        } while (uVar1 != uVar14);
      }
    }
    else if (0 < (int)uVar1) {
      dVar4 = pdVar13[2];
      uVar14 = 0;
      do {
        *(ulong *)((long)dVar18 + uVar14 * 8) =
             *(ulong *)((long)dVar4 + uVar14 * 8) ^ 0x8000000000000000;
        uVar14 = uVar14 + 1;
      } while (uVar1 != uVar14);
    }
  }
  *pdVar12 = dVar17 - *pdVar13;
  if (((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
     ((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  dVar17 = coord->fElem[1];
  lVar16 = CONCAT44(local_870.super_TPZVec<Fad<double>_>.fStore._4_4_,
                    local_870.super_TPZVec<Fad<double>_>.fStore._0_4_);
  lVar15 = CONCAT44(local_5b0.super_TPZVec<Fad<double>_>.fStore._4_4_,
                    local_5b0.super_TPZVec<Fad<double>_>.fStore._0_4_);
  uVar1 = *(uint *)(lVar16 + 0x28);
  uVar2 = *(uint *)(lVar15 + 0x28);
  if (uVar1 != uVar2) {
    if (uVar1 == 0) {
      if (uVar2 != 0) {
        if (*(void **)(lVar15 + 0x30) != (void *)0x0) {
          operator_delete__(*(void **)(lVar15 + 0x30));
        }
        *(undefined4 *)(lVar15 + 0x28) = 0;
        *(undefined8 *)(lVar15 + 0x30) = 0;
      }
    }
    else {
      if (uVar2 != 0) {
        if (*(void **)(lVar15 + 0x30) != (void *)0x0) {
          operator_delete__(*(void **)(lVar15 + 0x30));
        }
        *(undefined4 *)(lVar15 + 0x28) = 0;
        *(undefined8 *)(lVar15 + 0x30) = 0;
      }
      *(uint *)(lVar15 + 0x28) = uVar1;
      uVar14 = 0xffffffffffffffff;
      if (-1 < (int)uVar1) {
        uVar14 = (long)(int)uVar1 << 3;
      }
      pvVar11 = operator_new__(uVar14);
      *(void **)(lVar15 + 0x30) = pvVar11;
    }
  }
  if (uVar1 != 0) {
    lVar5 = *(long *)(lVar15 + 0x30);
    if (*(int *)(lVar16 + 0x28) == 0) {
      if (0 < (int)uVar1) {
        uVar14 = 0;
        do {
          *(ulong *)(lVar5 + uVar14 * 8) = *(ulong *)(lVar16 + 0x38) ^ 0x8000000000000000;
          uVar14 = uVar14 + 1;
        } while (uVar1 != uVar14);
      }
    }
    else if (0 < (int)uVar1) {
      lVar6 = *(long *)(lVar16 + 0x30);
      uVar14 = 0;
      do {
        *(ulong *)(lVar5 + uVar14 * 8) = *(ulong *)(lVar6 + uVar14 * 8) ^ 0x8000000000000000;
        uVar14 = uVar14 + 1;
      } while (uVar1 != uVar14);
    }
  }
  *(double *)(lVar15 + 0x20) = dVar17 - *(double *)(lVar16 + 0x20);
  if (((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
     ((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  dVar17 = coord->fElem[2];
  lVar16 = CONCAT44(local_870.super_TPZVec<Fad<double>_>.fStore._4_4_,
                    local_870.super_TPZVec<Fad<double>_>.fStore._0_4_);
  lVar15 = CONCAT44(local_5b0.super_TPZVec<Fad<double>_>.fStore._4_4_,
                    local_5b0.super_TPZVec<Fad<double>_>.fStore._0_4_);
  uVar1 = *(uint *)(lVar16 + 0x48);
  uVar2 = *(uint *)(lVar15 + 0x48);
  if (uVar1 != uVar2) {
    if (uVar1 == 0) {
      if (uVar2 != 0) {
        if (*(void **)(lVar15 + 0x50) != (void *)0x0) {
          operator_delete__(*(void **)(lVar15 + 0x50));
        }
        *(undefined4 *)(lVar15 + 0x48) = 0;
        *(undefined8 *)(lVar15 + 0x50) = 0;
      }
    }
    else {
      if (uVar2 != 0) {
        if (*(void **)(lVar15 + 0x50) != (void *)0x0) {
          operator_delete__(*(void **)(lVar15 + 0x50));
        }
        *(undefined4 *)(lVar15 + 0x48) = 0;
        *(undefined8 *)(lVar15 + 0x50) = 0;
      }
      *(uint *)(lVar15 + 0x48) = uVar1;
      uVar14 = 0xffffffffffffffff;
      if (-1 < (int)uVar1) {
        uVar14 = (long)(int)uVar1 << 3;
      }
      pvVar11 = operator_new__(uVar14);
      *(void **)(lVar15 + 0x50) = pvVar11;
    }
  }
  if (uVar1 != 0) {
    lVar5 = *(long *)(lVar15 + 0x50);
    if (*(int *)(lVar16 + 0x48) == 0) {
      if (0 < (int)uVar1) {
        uVar14 = 0;
        do {
          *(ulong *)(lVar5 + uVar14 * 8) = *(ulong *)(lVar16 + 0x58) ^ 0x8000000000000000;
          uVar14 = uVar14 + 1;
        } while (uVar1 != uVar14);
      }
    }
    else if (0 < (int)uVar1) {
      lVar6 = *(long *)(lVar16 + 0x50);
      uVar14 = 0;
      do {
        *(ulong *)(lVar5 + uVar14 * 8) = *(ulong *)(lVar6 + uVar14 * 8) ^ 0x8000000000000000;
        uVar14 = uVar14 + 1;
      } while (uVar1 != uVar14);
    }
  }
  *(double *)(lVar15 + 0x40) = dVar17 - *(double *)(lVar16 + 0x40);
  if ((0 < (coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow) &&
     (1 < (coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
    dVar17 = coord->fElem[(coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow];
    pdVar13 = (double *)
              CONCAT44(local_870.super_TPZVec<Fad<double>_>.fStore._4_4_,
                       local_870.super_TPZVec<Fad<double>_>.fStore._0_4_);
    pdVar12 = (double *)
              CONCAT44(local_710.super_TPZVec<Fad<double>_>.fStore._4_4_,
                       local_710.super_TPZVec<Fad<double>_>.fStore._0_4_);
    uVar1 = *(uint *)(pdVar13 + 1);
    uVar2 = *(uint *)(pdVar12 + 1);
    if (uVar1 != uVar2) {
      if (uVar1 == 0) {
        if (uVar2 != 0) {
          if ((void *)pdVar12[2] != (void *)0x0) {
            operator_delete__((void *)pdVar12[2]);
          }
          *(undefined4 *)(pdVar12 + 1) = 0;
          pdVar12[2] = 0.0;
        }
      }
      else {
        if (uVar2 != 0) {
          if ((void *)pdVar12[2] != (void *)0x0) {
            operator_delete__((void *)pdVar12[2]);
          }
          *(undefined4 *)(pdVar12 + 1) = 0;
          pdVar12[2] = 0.0;
        }
        *(uint *)(pdVar12 + 1) = uVar1;
        uVar14 = 0xffffffffffffffff;
        if (-1 < (int)uVar1) {
          uVar14 = (long)(int)uVar1 << 3;
        }
        pvVar11 = operator_new__(uVar14);
        pdVar12[2] = (double)pvVar11;
      }
    }
    if (uVar1 != 0) {
      dVar18 = pdVar12[2];
      if (*(int *)(pdVar13 + 1) == 0) {
        if (0 < (int)uVar1) {
          uVar14 = 0;
          do {
            *(double *)((long)dVar18 + uVar14 * 8) = -pdVar13[3];
            uVar14 = uVar14 + 1;
          } while (uVar1 != uVar14);
        }
      }
      else if (0 < (int)uVar1) {
        dVar4 = pdVar13[2];
        uVar14 = 0;
        do {
          *(ulong *)((long)dVar18 + uVar14 * 8) =
               *(ulong *)((long)dVar4 + uVar14 * 8) ^ 0x8000000000000000;
          uVar14 = uVar14 + 1;
        } while (uVar1 != uVar14);
      }
    }
    *pdVar12 = dVar17 - *pdVar13;
    if (((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
       ((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    dVar17 = coord->fElem[(coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow + 1];
    lVar16 = CONCAT44(local_870.super_TPZVec<Fad<double>_>.fStore._4_4_,
                      local_870.super_TPZVec<Fad<double>_>.fStore._0_4_);
    lVar15 = CONCAT44(local_710.super_TPZVec<Fad<double>_>.fStore._4_4_,
                      local_710.super_TPZVec<Fad<double>_>.fStore._0_4_);
    uVar1 = *(uint *)(lVar16 + 0x28);
    uVar2 = *(uint *)(lVar15 + 0x28);
    if (uVar1 != uVar2) {
      if (uVar1 == 0) {
        if (uVar2 != 0) {
          if (*(void **)(lVar15 + 0x30) != (void *)0x0) {
            operator_delete__(*(void **)(lVar15 + 0x30));
          }
          *(undefined4 *)(lVar15 + 0x28) = 0;
          *(undefined8 *)(lVar15 + 0x30) = 0;
        }
      }
      else {
        if (uVar2 != 0) {
          if (*(void **)(lVar15 + 0x30) != (void *)0x0) {
            operator_delete__(*(void **)(lVar15 + 0x30));
          }
          *(undefined4 *)(lVar15 + 0x28) = 0;
          *(undefined8 *)(lVar15 + 0x30) = 0;
        }
        *(uint *)(lVar15 + 0x28) = uVar1;
        uVar14 = 0xffffffffffffffff;
        if (-1 < (int)uVar1) {
          uVar14 = (long)(int)uVar1 << 3;
        }
        pvVar11 = operator_new__(uVar14);
        *(void **)(lVar15 + 0x30) = pvVar11;
      }
    }
    if (uVar1 != 0) {
      lVar5 = *(long *)(lVar15 + 0x30);
      if (*(int *)(lVar16 + 0x28) == 0) {
        if (0 < (int)uVar1) {
          uVar14 = 0;
          do {
            *(ulong *)(lVar5 + uVar14 * 8) = *(ulong *)(lVar16 + 0x38) ^ 0x8000000000000000;
            uVar14 = uVar14 + 1;
          } while (uVar1 != uVar14);
        }
      }
      else if (0 < (int)uVar1) {
        lVar6 = *(long *)(lVar16 + 0x30);
        uVar14 = 0;
        do {
          *(ulong *)(lVar5 + uVar14 * 8) = *(ulong *)(lVar6 + uVar14 * 8) ^ 0x8000000000000000;
          uVar14 = uVar14 + 1;
        } while (uVar1 != uVar14);
      }
    }
    *(double *)(lVar15 + 0x20) = dVar17 - *(double *)(lVar16 + 0x20);
    if ((2 < (coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow) &&
       (1 < (coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
      dVar17 = coord->fElem[(coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow + 2];
      lVar16 = CONCAT44(local_870.super_TPZVec<Fad<double>_>.fStore._4_4_,
                        local_870.super_TPZVec<Fad<double>_>.fStore._0_4_);
      lVar15 = CONCAT44(local_710.super_TPZVec<Fad<double>_>.fStore._4_4_,
                        local_710.super_TPZVec<Fad<double>_>.fStore._0_4_);
      uVar1 = *(uint *)(lVar16 + 0x48);
      uVar2 = *(uint *)(lVar15 + 0x48);
      if (uVar1 != uVar2) {
        if (uVar1 == 0) {
          if (uVar2 != 0) {
            if (*(void **)(lVar15 + 0x50) != (void *)0x0) {
              operator_delete__(*(void **)(lVar15 + 0x50));
            }
            *(undefined4 *)(lVar15 + 0x48) = 0;
            *(undefined8 *)(lVar15 + 0x50) = 0;
          }
        }
        else {
          if (uVar2 != 0) {
            if (*(void **)(lVar15 + 0x50) != (void *)0x0) {
              operator_delete__(*(void **)(lVar15 + 0x50));
            }
            *(undefined4 *)(lVar15 + 0x48) = 0;
            *(undefined8 *)(lVar15 + 0x50) = 0;
          }
          *(uint *)(lVar15 + 0x48) = uVar1;
          uVar14 = 0xffffffffffffffff;
          if (-1 < (int)uVar1) {
            uVar14 = (long)(int)uVar1 << 3;
          }
          pvVar11 = operator_new__(uVar14);
          *(void **)(lVar15 + 0x50) = pvVar11;
        }
      }
      if (uVar1 != 0) {
        lVar5 = *(long *)(lVar15 + 0x50);
        if (*(int *)(lVar16 + 0x48) == 0) {
          if (0 < (int)uVar1) {
            uVar14 = 0;
            do {
              *(ulong *)(lVar5 + uVar14 * 8) = *(ulong *)(lVar16 + 0x58) ^ 0x8000000000000000;
              uVar14 = uVar14 + 1;
            } while (uVar1 != uVar14);
          }
        }
        else if (0 < (int)uVar1) {
          lVar6 = *(long *)(lVar16 + 0x50);
          uVar14 = 0;
          do {
            *(ulong *)(lVar5 + uVar14 * 8) = *(ulong *)(lVar6 + uVar14 * 8) ^ 0x8000000000000000;
            uVar14 = uVar14 + 1;
          } while (uVar1 != uVar14);
        }
      }
      *(double *)(lVar15 + 0x40) = dVar17 - *(double *)(lVar16 + 0x40);
      X<Fad<double>>(this,coord,par,&local_870.super_TPZVec<Fad<double>_>);
      pFVar9 = local_450.super_TPZVec<Fad<double>_>.fStore;
      dVar17 = *(this->fCenter3D).super_TPZVec<double>.fStore;
      pdVar13 = (double *)
                CONCAT44(local_870.super_TPZVec<Fad<double>_>.fStore._4_4_,
                         local_870.super_TPZVec<Fad<double>_>.fStore._0_4_);
      uVar1 = *(uint *)(pdVar13 + 1);
      uVar2 = ((local_450.super_TPZVec<Fad<double>_>.fStore)->dx_).num_elts;
      if (uVar1 != uVar2) {
        if (uVar1 == 0) {
          if (uVar2 != 0) {
            pdVar12 = ((local_450.super_TPZVec<Fad<double>_>.fStore)->dx_).ptr_to_data;
            if (pdVar12 != (double *)0x0) {
              operator_delete__(pdVar12);
            }
            (pFVar9->dx_).num_elts = 0;
            (pFVar9->dx_).ptr_to_data = (double *)0x0;
          }
        }
        else {
          if (uVar2 != 0) {
            pdVar12 = ((local_450.super_TPZVec<Fad<double>_>.fStore)->dx_).ptr_to_data;
            if (pdVar12 != (double *)0x0) {
              operator_delete__(pdVar12);
            }
            (pFVar9->dx_).num_elts = 0;
            (pFVar9->dx_).ptr_to_data = (double *)0x0;
          }
          (pFVar9->dx_).num_elts = uVar1;
          uVar14 = 0xffffffffffffffff;
          if (-1 < (int)uVar1) {
            uVar14 = (long)(int)uVar1 << 3;
          }
          pdVar12 = (double *)operator_new__(uVar14);
          (pFVar9->dx_).ptr_to_data = pdVar12;
        }
      }
      pFVar10 = local_450.super_TPZVec<Fad<double>_>.fStore;
      if (uVar1 != 0) {
        pdVar12 = (pFVar9->dx_).ptr_to_data;
        if (*(int *)(pdVar13 + 1) == 0) {
          if (0 < (int)uVar1) {
            uVar14 = 0;
            do {
              pdVar12[uVar14] = -pdVar13[3];
              uVar14 = uVar14 + 1;
            } while (uVar1 != uVar14);
          }
        }
        else if (0 < (int)uVar1) {
          dVar18 = pdVar13[2];
          uVar14 = 0;
          do {
            pdVar12[uVar14] = -*(double *)((long)dVar18 + uVar14 * 8);
            uVar14 = uVar14 + 1;
          } while (uVar1 != uVar14);
        }
      }
      pFVar9->val_ = dVar17 - *pdVar13;
      dVar17 = (this->fCenter3D).super_TPZVec<double>.fStore[1];
      lVar16 = CONCAT44(local_870.super_TPZVec<Fad<double>_>.fStore._4_4_,
                        local_870.super_TPZVec<Fad<double>_>.fStore._0_4_);
      uVar1 = *(uint *)(lVar16 + 0x28);
      uVar2 = local_450.super_TPZVec<Fad<double>_>.fStore[1].dx_.num_elts;
      if (uVar1 != uVar2) {
        if (uVar1 == 0) {
          if (uVar2 != 0) {
            pdVar13 = local_450.super_TPZVec<Fad<double>_>.fStore[1].dx_.ptr_to_data;
            if (pdVar13 != (double *)0x0) {
              operator_delete__(pdVar13);
            }
            pFVar10[1].dx_.num_elts = 0;
            pFVar10[1].dx_.ptr_to_data = (double *)0x0;
          }
        }
        else {
          if (uVar2 != 0) {
            pdVar13 = local_450.super_TPZVec<Fad<double>_>.fStore[1].dx_.ptr_to_data;
            if (pdVar13 != (double *)0x0) {
              operator_delete__(pdVar13);
            }
            pFVar10[1].dx_.num_elts = 0;
            pFVar10[1].dx_.ptr_to_data = (double *)0x0;
          }
          pFVar10[1].dx_.num_elts = uVar1;
          uVar14 = 0xffffffffffffffff;
          if (-1 < (int)uVar1) {
            uVar14 = (long)(int)uVar1 << 3;
          }
          pdVar13 = (double *)operator_new__(uVar14);
          pFVar10[1].dx_.ptr_to_data = pdVar13;
        }
      }
      pFVar9 = local_450.super_TPZVec<Fad<double>_>.fStore;
      if (uVar1 != 0) {
        pdVar13 = pFVar10[1].dx_.ptr_to_data;
        if (*(int *)(lVar16 + 0x28) == 0) {
          if (0 < (int)uVar1) {
            uVar14 = 0;
            do {
              pdVar13[uVar14] = -*(double *)(lVar16 + 0x38);
              uVar14 = uVar14 + 1;
            } while (uVar1 != uVar14);
          }
        }
        else if (0 < (int)uVar1) {
          lVar15 = *(long *)(lVar16 + 0x30);
          uVar14 = 0;
          do {
            pdVar13[uVar14] = -*(double *)(lVar15 + uVar14 * 8);
            uVar14 = uVar14 + 1;
          } while (uVar1 != uVar14);
        }
      }
      pFVar10[1].val_ = dVar17 - *(double *)(lVar16 + 0x20);
      dVar17 = (this->fCenter3D).super_TPZVec<double>.fStore[2];
      lVar16 = CONCAT44(local_870.super_TPZVec<Fad<double>_>.fStore._4_4_,
                        local_870.super_TPZVec<Fad<double>_>.fStore._0_4_);
      uVar1 = *(uint *)(lVar16 + 0x48);
      uVar2 = local_450.super_TPZVec<Fad<double>_>.fStore[2].dx_.num_elts;
      if (uVar1 != uVar2) {
        if (uVar1 == 0) {
          if (uVar2 != 0) {
            pdVar13 = local_450.super_TPZVec<Fad<double>_>.fStore[2].dx_.ptr_to_data;
            if (pdVar13 != (double *)0x0) {
              operator_delete__(pdVar13);
            }
            pFVar9[2].dx_.num_elts = 0;
            pFVar9[2].dx_.ptr_to_data = (double *)0x0;
          }
        }
        else {
          if (uVar2 != 0) {
            pdVar13 = local_450.super_TPZVec<Fad<double>_>.fStore[2].dx_.ptr_to_data;
            if (pdVar13 != (double *)0x0) {
              operator_delete__(pdVar13);
            }
            pFVar9[2].dx_.num_elts = 0;
            pFVar9[2].dx_.ptr_to_data = (double *)0x0;
          }
          pFVar9[2].dx_.num_elts = uVar1;
          uVar14 = 0xffffffffffffffff;
          if (-1 < (int)uVar1) {
            uVar14 = (long)(int)uVar1 << 3;
          }
          pdVar13 = (double *)operator_new__(uVar14);
          pFVar9[2].dx_.ptr_to_data = pdVar13;
        }
      }
      if (uVar1 != 0) {
        pdVar13 = pFVar9[2].dx_.ptr_to_data;
        if (*(int *)(lVar16 + 0x48) == 0) {
          if (0 < (int)uVar1) {
            uVar14 = 0;
            do {
              pdVar13[uVar14] = -*(double *)(lVar16 + 0x58);
              uVar14 = uVar14 + 1;
            } while (uVar1 != uVar14);
          }
        }
        else if (0 < (int)uVar1) {
          lVar15 = *(long *)(lVar16 + 0x50);
          uVar14 = 0;
          do {
            pdVar13[uVar14] = -*(double *)(lVar15 + uVar14 * 8);
            uVar14 = uVar14 + 1;
          } while (uVar1 != uVar14);
        }
      }
      pFVar9[2].val_ = dVar17 - *(double *)(lVar16 + 0x40);
      local_950 = (Fad<double> *)
                  CONCAT44(local_5b0.super_TPZVec<Fad<double>_>.fStore._4_4_,
                           local_5b0.super_TPZVec<Fad<double>_>.fStore._0_4_);
      local_918 = local_950 + 1;
      local_970.fadexpr_.right_ =
           (Fad<double> *)
           CONCAT44(local_710.super_TPZVec<Fad<double>_>.fStore._4_4_,
                    local_710.super_TPZVec<Fad<double>_>.fStore._0_4_);
      local_990._0_8_ = &local_918;
      local_990._8_8_ = local_450.super_TPZVec<Fad<double>_>.fStore + 1;
      local_948 = local_970.fadexpr_.right_ + 1;
      local_898 = &local_950;
      local_8d8._0_8_ = local_8f8;
      local_970.fadexpr_.left_ = local_950 + 2;
      local_960.fadexpr_.left_ = &local_970;
      local_960.fadexpr_.right_ = local_450.super_TPZVec<Fad<double>_>.fStore + 2;
      local_8d8._8_8_ = &local_960;
      local_940._0_8_ = local_8d8;
      local_8b0 = local_970.fadexpr_.right_ + 2;
      local_940._8_8_ = (Fad<double> *)local_8a8;
      local_910.left_.constant_ = (double)local_970.fadexpr_.right_;
      local_8f8._0_8_ = (Fad<double> *)local_990;
      local_8f8._8_8_ =
           (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
            *)&local_898;
      local_8b8 = local_950;
      local_8a8._0_8_ = &local_8b8;
      local_8a8._8_8_ = local_960.fadexpr_.right_;
      local_890 = (Fad<double> *)local_990._8_8_;
      Fad<double>::operator=
                (gradx->fElem,
                 (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                  *)local_940);
      local_950 = (Fad<double> *)
                  CONCAT44(local_5b0.super_TPZVec<Fad<double>_>.fStore._4_4_,
                           local_5b0.super_TPZVec<Fad<double>_>.fStore._0_4_);
      local_8b8 = local_950 + 1;
      local_910.left_.constant_ =
           (double)CONCAT44(local_710.super_TPZVec<Fad<double>_>.fStore._4_4_,
                            local_710.super_TPZVec<Fad<double>_>.fStore._0_4_);
      local_970.fadexpr_.left_ = local_950 + 2;
      local_970.fadexpr_.right_ = (Fad<double> *)((long)local_910.left_.constant_ + 0x20);
      local_990._0_8_ = &local_918;
      local_990._8_8_ = local_450.super_TPZVec<Fad<double>_>.fStore;
      local_898 = &local_950;
      local_890 = local_450.super_TPZVec<Fad<double>_>.fStore;
      local_960.fadexpr_.right_ = local_450.super_TPZVec<Fad<double>_>.fStore + 2;
      local_960.fadexpr_.left_ = &local_970;
      local_8d8._0_8_ = local_8f8;
      local_8d8._8_8_ = &local_960;
      local_8b0 = (Fad<double> *)((long)local_910.left_.constant_ + 0x40);
      local_940._0_8_ = local_8d8;
      local_948 = local_970.fadexpr_.right_;
      local_940._8_8_ = (Fad<double> *)local_8a8;
      local_918 = (Fad<double> *)local_878;
      local_8f8._0_8_ = (Fad<double> *)local_990;
      local_8f8._8_8_ =
           (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
            *)&local_898;
      local_8a8._0_8_ = &local_8b8;
      local_8a8._8_8_ = local_960.fadexpr_.right_;
      local_878 = (undefined1  [8])local_8b8;
      Fad<double>::operator=
                (gradx->fElem + 1,
                 (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                  *)local_940);
      local_950 = (Fad<double> *)
                  CONCAT44(local_5b0.super_TPZVec<Fad<double>_>.fStore._4_4_,
                           local_5b0.super_TPZVec<Fad<double>_>.fStore._0_4_);
      local_970.fadexpr_.left_ = local_950 + 2;
      local_910.left_.constant_ =
           (double)CONCAT44(local_710.super_TPZVec<Fad<double>_>.fStore._4_4_,
                            local_710.super_TPZVec<Fad<double>_>.fStore._0_4_);
      local_990._0_8_ = &local_918;
      local_990._8_8_ = local_450.super_TPZVec<Fad<double>_>.fStore;
      local_948 = (Fad<double> *)((long)local_910.left_.constant_ + 0x40);
      local_898 = &local_950;
      local_890 = local_450.super_TPZVec<Fad<double>_>.fStore;
      local_970.fadexpr_.right_ = (Fad<double> *)((long)local_910.left_.constant_ + 0x20);
      local_960.fadexpr_.right_ = local_450.super_TPZVec<Fad<double>_>.fStore + 1;
      local_960.fadexpr_.left_ = &local_970;
      local_8d8._0_8_ = local_8f8;
      local_8d8._8_8_ = &local_960;
      local_8b8 = local_950 + 1;
      local_940._0_8_ = local_8d8;
      local_940._8_8_ = (Fad<double> *)local_8a8;
      local_918 = (Fad<double> *)local_878;
      local_8f8._0_8_ = (Fad<double> *)local_990;
      local_8f8._8_8_ =
           (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
            *)&local_898;
      local_8b0 = local_948;
      local_8a8._0_8_ = &local_8b8;
      local_8a8._8_8_ = local_960.fadexpr_.right_;
      local_878 = (undefined1  [8])local_970.fadexpr_.left_;
      Fad<double>::operator=
                (gradx->fElem + 2,
                 (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                  *)local_940);
      local_8f8._0_8_ =
           (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
            *)0x0;
      local_8f8._8_8_ = local_8f8._8_8_ & 0xffffffff00000000;
      local_8e8 = (double *)0x0;
      dStack_8e0 = 0.0;
      lVar16 = 0;
      do {
        lVar15 = CONCAT44(local_190.super_TPZVec<Fad<double>_>.fStore._4_4_,
                          local_190.super_TPZVec<Fad<double>_>.fStore._0_4_);
        if ((ABS(*(double *)(lVar15 + lVar16)) < 1e-12) &&
           (*(undefined8 *)(lVar15 + lVar16) = 0, *(int *)(lVar15 + 8 + lVar16) != 0)) {
          local_940._0_8_ = (Fad<double> *)0x0;
          Vector<double>::operator=((Vector<double> *)(lVar15 + lVar16 + 8),(double *)local_940);
        }
        local_940._0_8_ = (long)&gradx->fElem->val_ + lVar16;
        local_940._8_8_ = local_940._0_8_;
        Fad<double>::operator+=
                  ((Fad<double> *)local_8f8,
                   (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_940);
        lVar16 = lVar16 + 0x20;
      } while (lVar16 != 0x60);
      if (0.0 <= (double)local_8f8._0_8_) {
        dVar17 = this->fAngle * this->fRadius;
        FadFuncSqrt<Fad<double>_>::FadFuncSqrt
                  ((FadFuncSqrt<Fad<double>_> *)local_8d8,(Fad<double> *)local_8f8);
        FadExpr<FadFuncSqrt<Fad<double>_>_>::FadExpr
                  ((FadExpr<FadFuncSqrt<Fad<double>_>_> *)local_940,
                   (FadFuncSqrt<Fad<double>_> *)local_8d8);
        Fad<double>::~Fad((Fad<double> *)local_8d8);
        local_890 = (Fad<double> *)0x4000000000000000;
        dStack_888 = 0.0;
        local_910.left_.defaultVal = 0.0;
        local_910.left_.constant_ = dVar17;
        local_910.right_ =
             (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_> *)
             &local_898;
        local_880 = (FadExpr<FadFuncSqrt<Fad<double>_>_> *)local_940;
        if ((double)local_940._8_8_ < 0.0) {
          dVar18 = sqrt((double)local_940._8_8_);
        }
        else {
          dVar18 = SQRT((double)local_940._8_8_);
        }
        pFVar8 = local_910.right_;
        uVar7 = local_990._8_8_;
        local_990._0_8_ = dVar17 / (dVar18 + dVar18);
        iVar3 = ((((local_910.right_)->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts;
        local_990._8_8_ = local_990._8_8_ & 0xffffffff00000000;
        local_980 = (double *)0x0;
        if (0 < (long)iVar3) {
          local_990._12_4_ = SUB84(uVar7,4);
          local_990._8_4_ = iVar3;
          local_980 = (double *)operator_new__((long)iVar3 << 3);
        }
        local_978 = 0.0;
        lVar16 = (long)(((pFVar8->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts;
        if (0 < lVar16) {
          lVar15 = 0;
          do {
            vVar19 = FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>_>
                     ::dx(&local_910,(int)lVar15);
            local_980[lVar15] = vVar19;
            lVar15 = lVar15 + 1;
          } while (lVar16 != lVar15);
        }
        Fad<double>::~Fad((Fad<double> *)(local_940 + 8));
        lVar16 = 0;
        do {
          local_940._0_8_ = (long)&gradx->fElem->val_ + lVar16;
          local_940._8_8_ = (Fad<double> *)local_990;
          Fad<double>::operator=
                    ((Fad<double> *)local_940._0_8_,
                     (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_940);
          lVar16 = lVar16 + 0x20;
        } while (lVar16 != 0x60);
        Fad<double>::~Fad((Fad<double> *)local_990);
        Fad<double>::~Fad((Fad<double> *)local_8f8);
        TPZManVector<Fad<double>,_10>::~TPZManVector(&local_2f0);
        TPZManVector<Fad<double>,_10>::~TPZManVector(&local_870);
        TPZManVector<Fad<double>,_10>::~TPZManVector(&local_190);
        TPZManVector<Fad<double>,_10>::~TPZManVector(&local_710);
        TPZManVector<Fad<double>,_10>::~TPZManVector(&local_5b0);
        TPZManVector<Fad<double>,_10>::~TPZManVector(&local_450);
        return;
      }
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/SpecialMaps/tpzarc3d.h"
                 ,0xd2);
    }
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void GradX(TPZFMatrix<REAL> &coord, TPZVec<T> &par, TPZFMatrix<T> &gradx) const
        {
            
            /** Computing Axes */
            TPZManVector< T > Vpc(3,0.), Vpa(3,0.), Vpb(3,0.), Vt(3,0.), OUTv(3,0.);
            
            TPZManVector< T > middle(1, 0.);
            X(coord,middle,OUTv);
            
            /** Vector From MappedPoint to Ini */
            Vpa[0] = coord(0,0) - OUTv[0]; Vpa[1] = coord(1,0) - OUTv[1]; Vpa[2] = coord(2,0) - OUTv[2];
            
            /** Vector From MappedPoint to Fin */
            Vpb[0] = coord(0,1) - OUTv[0]; Vpb[1] = coord(1,1) - OUTv[1]; Vpb[2] = coord(2,1) - OUTv[2];
            
            X(coord,par,OUTv);
            
            /** Vector From MappedPoint to Center */
            Vpc[0] = fCenter3D[0] - OUTv[0]; Vpc[1] = fCenter3D[1] - OUTv[1]; Vpc[2] = fCenter3D[2] - OUTv[2];
            
            /** Tangent Vector From Point in the Arc */
            gradx(0) =  Vpa[1]*Vpb[0]*Vpc[1] - Vpa[0]*Vpb[1]*Vpc[1] + Vpa[2]*Vpb[0]*Vpc[2] - Vpa[0]*Vpb[2]*Vpc[2];
            gradx(1) = -Vpa[1]*Vpb[0]*Vpc[0] + Vpa[0]*Vpb[1]*Vpc[0] + Vpa[2]*Vpb[1]*Vpc[2] - Vpa[1]*Vpb[2]*Vpc[2];
            gradx(2) = -Vpa[2]*Vpb[0]*Vpc[0] + Vpa[0]*Vpb[2]*Vpc[0] - Vpa[2]*Vpb[1]*Vpc[1] + Vpa[1]*Vpb[2]*Vpc[1];
            
            T Vtnorm = 0.;
            for(int i = 0; i < 3; i++)
            {
                if( fabs(Vt[i]) < 1.E-12 ) Vt[i] = 0.;
                Vtnorm += gradx(i)*gradx(i);
            }
            if(Vtnorm < 0.) DebugStop();
//            if(sqrt(Vtnorm) < 1e-16) DebugStop();
            T scale = fAngle*fRadius/(2.*sqrt(Vtnorm));
            for(int j = 0; j < 3; j++) gradx(j) = gradx(j)*scale;

        }